

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

bool __thiscall mjs::object::delete_property(object *this,wstring_view *name)

{
  bool bVar1;
  property_attribute attributes;
  type *pppVar2;
  type *ppgVar3;
  type *props;
  type *it;
  pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*> local_30;
  wstring_view *local_20;
  wstring_view *name_local;
  object *this_local;
  
  local_20 = name;
  name_local = (wstring_view *)this;
  local_30 = find(this,*name);
  pppVar2 = std::get<0ul,mjs::object::property*,mjs::gc_vector<mjs::object::property>*>(&local_30);
  ppgVar3 = std::get<1ul,mjs::object::property*,mjs::gc_vector<mjs::object::property>*>(&local_30);
  if (*pppVar2 == (type)0x0) {
    this_local._7_1_ = true;
  }
  else {
    attributes = property::attributes(*pppVar2);
    bVar1 = has_attributes(attributes,dont_delete);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      gc_vector<mjs::object::property>::erase(*ppgVar3,*pppVar2);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool object::delete_property(const std::wstring_view& name) {
    auto [it, props] = find(name);
    if (!it) {
        return true;

    }
    if (has_attributes(it->attributes(), property_attribute::dont_delete)) {
        return false;
    }
    props->erase(it);
    return true;
}